

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O0

ON_4fColor ON_Sun::SunColorFromAltitude(double altitude)

{
  undefined8 uVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dBlend;
  double local_48;
  double temperature;
  double local_38;
  double value;
  ON_4fColor colDark;
  double altitude_local;
  ON_4fColor col;
  
  colDark.m_color._8_8_ = altitude;
  ON_4fColor::ON_4fColor((ON_4fColor *)&value,0,0,0x40,0xff);
  uVar1 = colDark.m_color._8_8_;
  dVar3 = TwilightZone();
  if (-dVar3 <= (double)uVar1) {
    temperature = 0.0;
    pdVar2 = std::max<double>(&temperature,(double *)(colDark.m_color + 2));
    dVar3 = pow(*pdVar2,1.5);
    local_38 = dVar3 * 30.0 + 500.0;
    dBlend = 5300.0;
    pdVar2 = std::min<double>(&dBlend,&local_38);
    local_48 = *pdVar2;
    _altitude_local = ColorTemperature(local_48);
    if ((double)colDark.m_color._8_8_ < 0.0) {
      dVar3 = -(double)colDark.m_color._8_8_;
      dVar4 = TwilightZone();
      ON_4fColor::BlendTo((ON_4fColor *)&altitude_local,(float)(dVar3 / dVar4),(ON_4fColor *)&value,
                          false);
    }
  }
  else {
    col.m_color[0] = colDark.m_color[0];
    col.m_color[1] = colDark.m_color[1];
    altitude_local = value;
  }
  return (ON_4fColor)_altitude_local;
}

Assistant:

ON_4fColor ON_Sun::SunColorFromAltitude(double altitude) // Static.
{
  ON_4fColor colDark(0, 0, 64, 255);

  if (altitude < -TwilightZone())
    return colDark;

  const double value = (30.0 * pow(std::max(0.0, altitude), 1.5)) + 500.0;
  auto temperature = std::min(5300.0, value);

  ON_4fColor col = ColorTemperature(temperature);

  if (altitude < 0.0)
  {
    const double dBlend = -altitude / TwilightZone();
    col.BlendTo(float(dBlend), colDark);
  }

  return col;
}